

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input-xkb.c
# Opt level: O0

void wpe_input_xkb_context_try_ensure_keymap(wpe_input_xkb_context *xkb_context)

{
  long lVar1;
  undefined8 uVar2;
  xkb_keymap *keymap;
  xkb_rule_names names;
  wpe_input_xkb_context *xkb_context_local;
  
  if (xkb_context->state == (xkb_state *)0x0) {
    names.options = (char *)xkb_context;
    memcpy(&keymap,&PTR_anon_var_dwarf_17e_00111da0,0x28);
    lVar1 = xkb_keymap_new_from_names(*(undefined8 *)names.options,&keymap,0);
    if (lVar1 != 0) {
      uVar2 = xkb_state_new(lVar1);
      *(undefined8 *)(names.options + 8) = uVar2;
      xkb_keymap_unref(lVar1);
    }
  }
  return;
}

Assistant:

static void
wpe_input_xkb_context_try_ensure_keymap(struct wpe_input_xkb_context* xkb_context)
{
    if (xkb_context->state)
        return;

    struct xkb_rule_names names = { "evdev", "pc105", "us", "", "" };
    struct xkb_keymap* keymap = xkb_keymap_new_from_names(xkb_context->context, &names, XKB_KEYMAP_COMPILE_NO_FLAGS);
    if (keymap) {
        xkb_context->state = xkb_state_new(keymap);
        xkb_keymap_unref(keymap);
    }
}